

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O3

FString strbin1(char *start)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  long lVar5;
  byte *in_RSI;
  byte *pbVar6;
  char cVar7;
  byte *pbVar8;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  start[0] = -0x54;
  start[1] = '=';
  start[2] = 'r';
  start[3] = '\0';
  start[4] = '\0';
  start[5] = '\0';
  start[6] = '\0';
  start[7] = '\0';
  do {
    while( true ) {
      pbVar6 = in_RSI + 1;
      bVar3 = *in_RSI;
      if (bVar3 == 0x5c) break;
      if (bVar3 == 0) {
        return (FString)start;
      }
      FString::operator+=((FString *)start,bVar3);
      in_RSI = pbVar6;
    }
    bVar3 = *pbVar6;
    if (bVar3 < 0x58) {
      if (bVar3 - 0x30 < 8) {
        pbVar6 = in_RSI + 4;
        lVar5 = 0;
        cVar2 = '\0';
        do {
          cVar2 = cVar2 * '\b';
          if ((in_RSI[lVar5 + 1] & 0xf8) != 0x30) {
            pbVar6 = in_RSI + lVar5;
            break;
          }
          cVar2 = cVar2 + in_RSI[lVar5 + 1] + -0x30;
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 != 3);
        FString::operator+=((FString *)start,cVar2);
      }
      else if (bVar3 != 10) goto switchD_0035d5a4_caseD_64;
    }
    else {
      switch(bVar3) {
      case 0x6e:
        bVar3 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x75:
      case 0x77:
        break;
      case 0x72:
        bVar3 = 0xd;
        break;
      case 0x74:
        bVar3 = 9;
        break;
      case 0x76:
        bVar3 = 0xb;
        break;
      case 0x78:
switchD_0035d5b4_caseD_78:
        cVar2 = '\0';
        pbVar8 = pbVar6;
        bVar1 = true;
        do {
          bVar4 = bVar1;
          bVar3 = pbVar8[1];
          cVar7 = -0x30;
          if (((9 < (byte)(bVar3 - 0x30)) && (cVar7 = -0x57, 5 < (byte)(bVar3 + 0x9f))) &&
             (cVar7 = -0x37, pbVar6 = pbVar8, 5 < (byte)(bVar3 + 0xbf))) break;
          pbVar8 = pbVar8 + 1;
          cVar2 = cVar2 * '\x10' + cVar7 + bVar3;
          pbVar6 = in_RSI + 3;
          bVar1 = false;
        } while (bVar4);
        FString::operator+=((FString *)start,cVar2);
        goto LAB_0035d660;
      default:
        switch(bVar3) {
        case 0x61:
          bVar3 = 7;
          break;
        case 0x62:
          bVar3 = 8;
          break;
        case 99:
          bVar3 = 0x1c;
          break;
        case 100:
        case 0x65:
          break;
        case 0x66:
          bVar3 = 0xc;
          break;
        default:
          if (bVar3 == 0x58) goto switchD_0035d5b4_caseD_78;
        }
      }
switchD_0035d5a4_caseD_64:
      FString::operator+=((FString *)start,bVar3);
    }
LAB_0035d660:
    in_RSI = pbVar6 + 1;
  } while( true );
}

Assistant:

FString strbin1 (const char *start)
{
	FString result;
	const char *p = start;
	char c;
	int i;

	while ( (c = *p++) ) {
		if (c != '\\') {
			result << c;
		} else {
			switch (*p) {
				case 'a':
					result << '\a';
					break;
				case 'b':
					result << '\b';
					break;
				case 'c':
					result << '\034';	// TEXTCOLOR_ESCAPE
					break;
				case 'f':
					result << '\f';
					break;
				case 'n':
					result << '\n';
					break;
				case 't':
					result << '\t';
					break;
				case 'r':
					result << '\r';
					break;
				case 'v':
					result << '\v';
					break;
				case '?':
					result << '\?';
					break;
				case '\n':
					break;
				case 'x':
				case 'X':
					c = 0;
					for (i = 0; i < 2; i++)
					{
						p++;
						if (*p >= '0' && *p <= '9')
							c = (c << 4) + *p-'0';
						else if (*p >= 'a' && *p <= 'f')
							c = (c << 4) + 10 + *p-'a';
						else if (*p >= 'A' && *p <= 'F')
							c = (c << 4) + 10 + *p-'A';
						else
						{
							p--;
							break;
						}
					}
					result << c;
					break;
				case '0':
				case '1':
				case '2':
				case '3':
				case '4':
				case '5':
				case '6':
				case '7':
					c = 0;
					for (i = 0; i < 3; i++) {
						c <<= 3;
						if (*p >= '0' && *p <= '7')
							c += *p-'0';
						else
						{
							p--;
							break;
						}
						p++;
					}
					result << c;
					break;
				default:
					result << *p;
					break;
			}
			p++;
		}
	}
	return result;
}